

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastops_ut.cpp
# Opt level: O0

void TestFunc<TAvxTanh<false,true>,TTanhCompare<false,true>,double>
               (mt19937_64 *rng,TTestExpOpts opts)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  ostream *poVar4;
  undefined8 uVar5;
  FastOpsTestException *this;
  undefined4 uVar6;
  result_type_conflict rVar7;
  double dVar8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  ulong in_stack_00000018;
  ulong in_stack_00000020;
  ulong in_stack_00000028;
  ulong in_stack_00000030;
  ulong in_stack_00000038;
  byte in_stack_00000040;
  byte in_stack_00000041;
  ostringstream out_4;
  ostringstream out_3;
  double approxVal;
  double trueVal;
  size_t j2;
  ostringstream out_2;
  size_t j_2;
  ostringstream out_1;
  size_t j_1;
  ostringstream out;
  size_t idx;
  double val;
  size_t j;
  size_t i;
  double *outData;
  double *outDataStart;
  double *origInData;
  double *inData;
  double *inDataStart;
  char *outVCharData;
  char *inVCharData;
  size_t padOffset;
  uniform_real_distribution<double> dis;
  vector<char,_std::allocator<char>_> outV;
  vector<char,_std::allocator<char>_> inV;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff4f8;
  uniform_real_distribution<double> *in_stack_fffffffffffff500;
  string *in_stack_fffffffffffff508;
  FastOpsTestException *in_stack_fffffffffffff510;
  size_type in_stack_fffffffffffff518;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff520;
  ostringstream local_8e8 [383];
  undefined1 local_769;
  ostringstream local_748 [376];
  double local_5d0;
  double local_5c8;
  long local_5c0;
  undefined1 local_5b1;
  ostringstream local_590 [376];
  ulong local_418;
  undefined1 local_409;
  ostringstream local_3e8 [376];
  ulong local_270;
  undefined1 local_261;
  ostringstream local_240 [376];
  long local_c8;
  double local_c0;
  ulong local_b8;
  ulong local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  long local_70;
  allocator<char> local_51;
  vector<char,_std::allocator<char>_> local_50;
  allocator<char> local_21;
  vector<char,_std::allocator<char>_> local_20;
  undefined1 auVar9 [16];
  undefined4 uVar12;
  
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffff520,in_stack_fffffffffffff518,
             (allocator_type *)in_stack_fffffffffffff510);
  std::allocator<char>::~allocator(&local_21);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffff520,in_stack_fffffffffffff518,
             (allocator_type *)in_stack_fffffffffffff510);
  std::allocator<char>::~allocator(&local_51);
  std::uniform_real_distribution<double>::uniform_real_distribution
            (in_stack_fffffffffffff500,(double)in_stack_fffffffffffff4f8,8.66444405308732e-318);
  local_70 = (in_stack_00000028 >> 1) << 3;
  local_78 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1ac2a1);
  local_80 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1ac2b6);
  for (; ((ulong)(local_78 + local_70) & 0x1f) != in_stack_00000030; local_78 = local_78 + 1) {
  }
  for (; ((ulong)(local_80 + local_70) & 0x1f) != in_stack_00000038; local_80 = local_80 + 1) {
  }
  local_88 = local_78;
  local_98 = local_78 + (in_stack_00000028 >> 1) * 8;
  local_a0 = local_80;
  local_a8 = local_80 + (in_stack_00000028 >> 1) * 8;
  local_90 = local_98;
  if ((in_stack_00000041 & 1) != 0) {
    local_90 = local_a8;
  }
  local_b0 = 0;
  do {
    if (in_stack_00000018 / in_stack_00000020 + 1 <= local_b0) {
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff510);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff510);
      return;
    }
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1ac472);
    sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_20);
    memset(pcVar2,0,sVar3);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1ac4a6);
    sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_50);
    memset(pcVar2,0,sVar3);
    for (local_b8 = 0; local_b8 < in_stack_00000020; local_b8 = local_b8 + 1) {
      if ((in_stack_00000040 & 1) == 0) {
        local_c8 = in_stack_00000020 * local_b0 + local_b8;
        auVar9._8_4_ = (int)((ulong)local_c8 >> 0x20);
        auVar9._0_8_ = local_c8;
        auVar9._12_4_ = 0x45300000;
        uVar6 = (undefined4)local_c8;
        uVar12 = (undefined4)(in_stack_00000018 >> 0x20);
        auVar11._8_4_ = uVar12;
        auVar11._0_8_ = in_stack_00000018;
        auVar11._12_4_ = 0x45300000;
        rVar7 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
        auVar10._8_4_ = uVar12;
        auVar10._0_8_ = in_stack_00000018;
        auVar10._12_4_ = 0x45300000;
        local_c0 = (((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) /
                   ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)in_stack_00000018) - 4503599627370496.0))) *
                   (double)(in_stack_00000010 - in_stack_0000000c) + (double)in_stack_0000000c +
                   (rVar7 + rVar7 + -1.0) /
                   ((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)in_stack_00000018) - 4503599627370496.0));
      }
      else {
        rVar7 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
        local_c0 = rVar7 * (double)(in_stack_00000010 - in_stack_0000000c) +
                   (double)in_stack_0000000c;
      }
      if (in_stack_00000008 != 0) {
        if (in_stack_00000008 == 1) {
          local_c0 = exp(local_c0);
        }
        else if (1 < in_stack_00000008 - 2U) {
          std::__cxx11::ostringstream::ostringstream(local_240);
          poVar4 = std::operator<<((ostream *)local_240,"assertion failed ");
          poVar4 = std::operator<<(poVar4,"false");
          poVar4 = std::operator<<(poVar4," at ");
          poVar4 = std::operator<<(poVar4,"TestFunc");
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          std::ostream::operator<<(poVar4,0x7f);
          local_261 = 1;
          uVar5 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          FastOpsTestException::FastOpsTestException
                    (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
          local_261 = 0;
          __cxa_throw(uVar5,&FastOpsTestException::typeinfo,
                      FastOpsTestException::~FastOpsTestException);
        }
      }
      WriteUnaligned<double>(local_90 + local_b8 * 8,&local_c0);
      WriteUnaligned<double>(local_98 + local_b8 * 8,&local_c0);
    }
    TAvxTanh<false,_true>::Apply<double>
              ((double *)in_stack_fffffffffffff500,(size_t)in_stack_fffffffffffff4f8,
               (double *)0x1ac934);
    if ((in_stack_00000041 & 1) == 0) {
      for (local_270 = 0; local_270 < in_stack_00000020 + in_stack_00000028;
          local_270 = local_270 + 1) {
        if ((local_88 + local_270 * 8 < local_90) ||
           (local_90 + in_stack_00000020 * 8 <= local_88 + local_270 * 8)) {
          dVar8 = ReadUnaligned<double>(local_88 + local_270 * 8);
          if ((dVar8 != 0.0) || (NAN(dVar8))) {
            std::__cxx11::ostringstream::ostringstream(local_3e8);
            poVar4 = std::operator<<((ostream *)local_3e8,"assertion failed ");
            poVar4 = std::operator<<(poVar4,"ReadUnaligned<T>(inDataStart + j) == 0");
            poVar4 = std::operator<<(poVar4," at ");
            poVar4 = std::operator<<(poVar4,"TestFunc");
            poVar4 = std::operator<<(poVar4,", ");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,":");
            std::ostream::operator<<(poVar4,0x8a);
            local_409 = 1;
            uVar5 = __cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            FastOpsTestException::FastOpsTestException
                      (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
            local_409 = 0;
            __cxa_throw(uVar5,&FastOpsTestException::typeinfo,
                        FastOpsTestException::~FastOpsTestException);
          }
        }
      }
    }
    for (local_418 = 0; local_418 < in_stack_00000020 + in_stack_00000028; local_418 = local_418 + 1
        ) {
      if ((local_a0 + local_418 * 8 < local_a8) ||
         (local_a8 + in_stack_00000020 * 8 <= local_a0 + local_418 * 8)) {
        dVar8 = ReadUnaligned<double>(local_a0 + local_418 * 8);
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          std::__cxx11::ostringstream::ostringstream(local_590);
          poVar4 = std::operator<<((ostream *)local_590,"assertion failed ");
          poVar4 = std::operator<<(poVar4,"ReadUnaligned<T>(outDataStart + j) == 0");
          poVar4 = std::operator<<(poVar4," at ");
          poVar4 = std::operator<<(poVar4,"TestFunc");
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          std::ostream::operator<<(poVar4,0x91);
          local_5b1 = 1;
          uVar5 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          FastOpsTestException::FastOpsTestException
                    (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
          local_5b1 = 0;
          __cxa_throw(uVar5,&FastOpsTestException::typeinfo,
                      FastOpsTestException::~FastOpsTestException);
        }
      }
      else {
        local_5c0 = (long)(local_a0 + (local_418 * 8 - (long)local_a8)) >> 3;
        switch(in_stack_00000008) {
        case 0:
          dVar8 = ReadUnaligned<double>(local_98 + local_5c0 * 8);
          local_5c8 = exp(dVar8);
          local_5d0 = ReadUnaligned<double>(local_a0 + local_418 * 8);
          break;
        case 1:
          dVar8 = ReadUnaligned<double>(local_98 + local_5c0 * 8);
          local_5c8 = log(dVar8);
          local_5d0 = ReadUnaligned<double>(local_a0 + local_418 * 8);
          break;
        case 2:
          dVar8 = ReadUnaligned<double>(local_98 + local_5c0 * 8);
          dVar8 = exp(-dVar8);
          local_5c8 = 1.0 / (dVar8 + 1.0);
          local_5d0 = ReadUnaligned<double>(local_a0 + local_418 * 8);
          break;
        case 3:
          dVar8 = ReadUnaligned<double>(local_98 + local_5c0 * 8);
          local_5c8 = tanh(dVar8);
          local_5d0 = ReadUnaligned<double>(local_a0 + local_418 * 8);
          break;
        default:
          std::__cxx11::ostringstream::ostringstream(local_748);
          poVar4 = std::operator<<((ostream *)local_748,"assertion failed ");
          poVar4 = std::operator<<(poVar4,"false");
          poVar4 = std::operator<<(poVar4," at ");
          poVar4 = std::operator<<(poVar4,"TestFunc");
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          std::ostream::operator<<(poVar4,0xac);
          local_769 = 1;
          uVar5 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          FastOpsTestException::FastOpsTestException
                    (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
          local_769 = 0;
          __cxa_throw(uVar5,&FastOpsTestException::typeinfo,
                      FastOpsTestException::~FastOpsTestException);
        }
        ReadUnaligned<double>(local_98 + local_5c0 * 8);
        bVar1 = TTanhCompare<false,_true>::Compare
                          ((double)in_stack_fffffffffffff508,(double)in_stack_fffffffffffff500,
                           (double)in_stack_fffffffffffff4f8);
        if (!bVar1) {
          dVar8 = ReadUnaligned<double>(local_98 + local_5c0 * 8);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,dVar8);
          poVar4 = std::operator<<(poVar4,"\t");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_5c8);
          poVar4 = std::operator<<(poVar4,"\t");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_5d0);
          poVar4 = std::operator<<(poVar4,"\t");
          dVar8 = GetRelError((double)in_stack_fffffffffffff500,(double)in_stack_fffffffffffff4f8);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar8);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::ostringstream(local_8e8);
          poVar4 = std::operator<<((ostream *)local_8e8,"assertion failed ");
          poVar4 = std::operator<<(poVar4,"false");
          poVar4 = std::operator<<(poVar4," at ");
          poVar4 = std::operator<<(poVar4,"TestFunc");
          poVar4 = std::operator<<(poVar4,", ");
          this = (FastOpsTestException *)
                 std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                );
          poVar4 = std::operator<<((ostream *)this,":");
          std::ostream::operator<<(poVar4,0xb1);
          uVar5 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          FastOpsTestException::FastOpsTestException(this,(string *)poVar4);
          __cxa_throw(uVar5,&FastOpsTestException::typeinfo,
                      FastOpsTestException::~FastOpsTestException);
        }
      }
    }
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

void TestFunc(std::mt19937_64& rng, TTestExpOpts opts) {
    std::vector<char> inV((opts.VecSize + opts.PadSize) * sizeof(T) + 32);
    std::vector<char> outV((opts.VecSize + opts.PadSize + 4) * sizeof(T) + 32);
    std::uniform_real_distribution<> dis(0, 1.0);

    size_t padOffset = opts.PadSize / 2;
    padOffset *= sizeof(T);

    char* inVCharData = inV.data();
    char* outVCharData = outV.data();
    while ((size_t)(inVCharData + padOffset) % 32 != opts.InputAlignBytes) {
        ++inVCharData;
    }
    while ((size_t)(outVCharData + padOffset) % 32 != opts.OutputAlignBytes) {
        ++outVCharData;
    }

    T* inDataStart = (T*)inVCharData;
    T* inData = inDataStart + opts.PadSize / 2;
    T* origInData = inData;
    T* outDataStart = (T*)outVCharData;
    T* outData = outDataStart + opts.PadSize / 2;

    if (opts.Inplace) {
        inData = outData;
    }

    for (size_t i = 0; i < opts.N / opts.VecSize + 1; ++i) {
        std::memset(inV.data(), 0, inV.size());
        std::memset(outV.data(), 0, outV.size());
        for (size_t j = 0; j < opts.VecSize; ++j) {
            T val;
            if (opts.IsRandom) {
                val = dis(rng) * (opts.Max - opts.Min) + opts.Min;
            } else {
                size_t idx = opts.VecSize * i + j;
                val = opts.Min + idx * 1.0 / opts.N * (opts.Max - opts.Min) + (2 * dis(rng) - 1) * 1.0 / opts.N;
            }

            switch (opts.Func) {
                case EFunc::Log:
                    val = exp(val);
                    break;
                case EFunc::Exp:
                case EFunc::Sigmoid:
                case EFunc::Tanh:
                    break;
                default:
                    UNIT_ASSERT(false);
            }

            WriteUnaligned(inData + j, val);
            WriteUnaligned(origInData + j, val);
        }

        TFunc::Apply(inData, opts.VecSize, outData);
        if (!opts.Inplace) {
            for (size_t j = 0; j < opts.VecSize + opts.PadSize; ++j) {
                if (inDataStart + j < inData || inDataStart + j >= inData + opts.VecSize) {
                    UNIT_ASSERT(ReadUnaligned<T>(inDataStart + j) == 0);
                }
            }
        }

        for (size_t j = 0; j < opts.VecSize + opts.PadSize; ++j) {
            if (outDataStart + j < outData || outDataStart + j >= outData + opts.VecSize) {
                UNIT_ASSERT(ReadUnaligned<T>(outDataStart + j) == 0);
            } else {
                size_t j2 = outDataStart + j - outData;
                T trueVal;
                T approxVal;
                switch (opts.Func) {
                    case EFunc::Log: {
                        trueVal = log(ReadUnaligned<T>(origInData + j2));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    case EFunc::Exp: {
                        trueVal = exp(ReadUnaligned<T>(origInData + j2));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    case EFunc::Sigmoid: {
                        trueVal = 1.0 / (1.0 + exp(-ReadUnaligned<T>(origInData + j2)));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    case EFunc::Tanh: {
                        trueVal = tanh(ReadUnaligned<T>(origInData + j2));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    default:
                        UNIT_ASSERT(false);
                }

                if (!TCompare::Compare(ReadUnaligned<T>(origInData + j2), trueVal, approxVal)) {
                    std::cerr << ReadUnaligned<T>(origInData + j2) << "\t" << trueVal << "\t" << approxVal << "\t" << GetRelError(trueVal, approxVal) << std::endl;
                    UNIT_ASSERT(false);
                }
            }
        }
    }
}